

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

cmTarget * __thiscall
cmMakefile::AddExecutable
          (cmMakefile *this,string *exeName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *srcs,bool excludeFromAll)

{
  bool bVar1;
  cmTarget *this_00;
  undefined3 in_register_00000009;
  allocator<char> local_41;
  string local_40;
  
  this_00 = AddNewTarget(this,EXECUTABLE,exeName);
  if (CONCAT31(in_register_00000009,excludeFromAll) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"EXCLUDE_FROM_ALL",&local_41);
    bVar1 = GetPropertyAsBool(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (!bVar1) goto LAB_0016c4d1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"EXCLUDE_FROM_ALL",&local_41);
  cmTarget::SetProperty(this_00,&local_40,"TRUE");
  std::__cxx11::string::~string((string *)&local_40);
LAB_0016c4d1:
  cmTarget::AddSources(this_00,srcs);
  AddGlobalLinkInformation(this,this_00);
  return this_00;
}

Assistant:

cmTarget* cmMakefile::AddExecutable(const std::string& exeName,
                                    const std::vector<std::string>& srcs,
                                    bool excludeFromAll)
{
  cmTarget* target = this->AddNewTarget(cmStateEnums::EXECUTABLE, exeName);
  if (excludeFromAll || this->GetPropertyAsBool("EXCLUDE_FROM_ALL")) {
    target->SetProperty("EXCLUDE_FROM_ALL", "TRUE");
  }
  target->AddSources(srcs);
  this->AddGlobalLinkInformation(*target);
  return target;
}